

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::GetRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  uint uVar1;
  int number;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  uint32 uVar5;
  LogMessage *pLVar6;
  Descriptor *pDVar7;
  MapFieldBase *this_00;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"GetRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != cpptype) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRawRepeatedField",cpptype);
  }
  if ((-1 < ctype) && (*(int *)(*(long *)(field + 0x78) + 0x48) != ctype)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6c5);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (field->options().ctype()) == (ctype): ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"subtype mismatch");
    internal::LogFinisher::operator=(&local_69,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((desc != (Descriptor *)0x0) && (pDVar7 = FieldDescriptor::message_type(field), pDVar7 != desc)
     ) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6c7);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"wrong submessage type");
    internal::LogFinisher::operator=(&local_69,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    TVar4 = FieldDescriptor::type(field);
    bVar2 = FieldDescriptor::is_packed(field);
    this_00 = (MapFieldBase *)
              internal::ExtensionSet::MutableRawRepeatedField
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                         number,(FieldType)TVar4,bVar2,field);
  }
  else {
    bVar2 = FieldDescriptor::is_map(field);
    uVar5 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5)
    ;
    if (bVar2) {
      this_00 = (MapFieldBase *)internal::MapFieldBase::GetRepeatedField(this_00);
    }
  }
  return this_00;
}

Assistant:

const void* Reflection::GetRawRepeatedField(const Message& message,
                                            const FieldDescriptor* field,
                                            FieldDescriptor::CppType cpptype,
                                            int ctype,
                                            const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("GetRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_, field, "GetRawRepeatedField",
                                   cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    // Should use extension_set::GetRawRepeatedField. However, the required
    // parameter "default repeated value" is not very easy to get here.
    // Map is not supported in extensions, it is acceptable to use
    // extension_set::MutableRawRepeatedField which does not change the message.
    return MutableExtensionSet(const_cast<Message*>(&message))
        ->MutableRawRepeatedField(field->number(), field->type(),
                                  field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return &(GetRawNonOneof<MapFieldBase>(message, field).GetRepeatedField());
    }
    return &GetRawNonOneof<char>(message, field);
  }
}